

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

OPJ_BOOL opj_dwt_encode_procedure
                   (opj_tcd_tilecomp_t *tilec,
                   _func_void_OPJ_INT32_ptr_OPJ_INT32_OPJ_INT32_OPJ_INT32 *p_function)

{
  opj_tcd_resolution_t *poVar1;
  int iVar2;
  int iVar3;
  OPJ_UINT32 i;
  uint uVar4;
  int iVar5;
  OPJ_INT32 *pOVar6;
  uint uVar7;
  OPJ_UINT32 OVar8;
  OPJ_BOOL OVar9;
  uint uVar10;
  OPJ_INT32 *ptr;
  OPJ_INT32 *pOVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  OPJ_INT32 *pOVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  opj_tcd_resolution_t *poVar27;
  OPJ_INT32 *pOVar28;
  
  iVar2 = tilec->x1;
  iVar3 = tilec->x0;
  lVar20 = (long)iVar3;
  i = tilec->numresolutions;
  pOVar6 = tilec->data;
  poVar27 = tilec->resolutions;
  OVar8 = opj_dwt_max_resolution(poVar27,i);
  ptr = (OPJ_INT32 *)opj_malloc((ulong)OVar8 << 2);
  OVar9 = 0;
  if (ptr != (OPJ_INT32 *)0x0 || OVar8 == 0) {
    uVar19 = (long)(int)i - 1;
    poVar27 = poVar27 + uVar19;
    while (iVar17 = (int)uVar19, uVar19 = (ulong)(iVar17 - 1), iVar17 != 0) {
      uVar10 = poVar27->x0;
      uVar24 = poVar27->x1 - uVar10;
      iVar17 = poVar27->y1;
      uVar4 = poVar27->y0;
      uVar25 = iVar17 - uVar4;
      iVar14 = poVar27[-1].y0;
      iVar21 = poVar27[-1].y1;
      iVar26 = iVar21 - iVar14;
      uVar13 = (ulong)((uVar4 & 1) * 4);
      uVar7 = uVar25;
      if ((int)uVar25 < 1) {
        uVar7 = 0;
      }
      uVar23 = 0;
      if (0 < (int)uVar24) {
        uVar23 = (ulong)uVar24;
      }
      poVar1 = poVar27 + -1;
      iVar18 = poVar27[-1].x1;
      iVar5 = poVar27[-1].x0;
      pOVar22 = (OPJ_INT32 *)((long)iVar26 * (long)(iVar2 - iVar3) * 4 + (long)pOVar6);
      pOVar28 = pOVar6;
      for (uVar12 = 0; uVar12 != uVar23; uVar12 = uVar12 + 1) {
        pOVar11 = pOVar28;
        for (uVar15 = 0; uVar7 != uVar15; uVar15 = uVar15 + 1) {
          ptr[uVar15] = *pOVar11;
          pOVar11 = pOVar11 + (iVar2 - lVar20);
        }
        (*p_function)(ptr,uVar25 - iVar26,iVar26,uVar4 & 1);
        pOVar11 = pOVar28;
        for (lVar16 = 0; iVar26 != (int)lVar16; lVar16 = lVar16 + 1) {
          *pOVar11 = *(OPJ_INT32 *)((long)ptr + lVar16 * 8 + uVar13);
          pOVar11 = pOVar11 + (iVar2 - lVar20);
        }
        pOVar11 = pOVar22;
        for (lVar16 = 0; ((iVar17 + iVar14) - uVar4) - iVar21 != (int)lVar16; lVar16 = lVar16 + 1) {
          *pOVar11 = *(OPJ_INT32 *)((long)ptr + lVar16 * 8 + (4 - uVar13));
          pOVar11 = pOVar11 + (iVar2 - lVar20);
        }
        pOVar28 = pOVar28 + 1;
        pOVar22 = pOVar22 + 1;
      }
      iVar18 = iVar18 - iVar5;
      uVar10 = uVar10 & 1;
      iVar14 = uVar24 - iVar18;
      uVar13 = (ulong)(uVar10 * 4);
      iVar17 = 0;
      if (0 < iVar18) {
        iVar17 = iVar18;
      }
      iVar21 = 0;
      if (0 < iVar14) {
        iVar21 = iVar14;
      }
      pOVar28 = pOVar6 + iVar18;
      pOVar22 = pOVar6;
      for (uVar12 = 0; poVar27 = poVar1, uVar12 != uVar7; uVar12 = uVar12 + 1) {
        for (uVar15 = 0; uVar23 != uVar15; uVar15 = uVar15 + 1) {
          ptr[uVar15] = pOVar22[uVar15];
        }
        (*p_function)(ptr,iVar14,iVar18,uVar10);
        for (lVar16 = 0; iVar17 != (int)lVar16; lVar16 = lVar16 + 1) {
          pOVar22[lVar16] = *(OPJ_INT32 *)((long)ptr + lVar16 * 8 + uVar13);
        }
        for (lVar16 = 0; iVar21 != (int)lVar16; lVar16 = lVar16 + 1) {
          pOVar28[lVar16] = *(OPJ_INT32 *)((long)ptr + lVar16 * 8 + (4 - uVar13));
        }
        pOVar22 = pOVar22 + (iVar2 - lVar20);
        pOVar28 = pOVar28 + (iVar2 - lVar20);
      }
    }
    opj_free(ptr);
    OVar9 = 1;
  }
  return OVar9;
}

Assistant:

static INLINE OPJ_BOOL opj_dwt_encode_procedure(opj_tcd_tilecomp_t * tilec,
        void (*p_function)(OPJ_INT32 *, OPJ_INT32, OPJ_INT32, OPJ_INT32))
{
    OPJ_INT32 i, j, k;
    OPJ_INT32 *a = 00;
    OPJ_INT32 *aj = 00;
    OPJ_INT32 *bj = 00;
    OPJ_INT32 w, l;

    OPJ_INT32 rw;           /* width of the resolution level computed   */
    OPJ_INT32 rh;           /* height of the resolution level computed  */
    OPJ_SIZE_T l_data_size;

    opj_tcd_resolution_t * l_cur_res = 0;
    opj_tcd_resolution_t * l_last_res = 0;

    w = tilec->x1 - tilec->x0;
    l = (OPJ_INT32)tilec->numresolutions - 1;
    a = tilec->data;

    l_cur_res = tilec->resolutions + l;
    l_last_res = l_cur_res - 1;

    l_data_size = opj_dwt_max_resolution(tilec->resolutions, tilec->numresolutions);
    /* overflow check */
    if (l_data_size > (SIZE_MAX / sizeof(OPJ_INT32))) {
        /* FIXME event manager error callback */
        return OPJ_FALSE;
    }
    l_data_size *= sizeof(OPJ_INT32);
    bj = (OPJ_INT32*)opj_malloc(l_data_size);
    /* l_data_size is equal to 0 when numresolutions == 1 but bj is not used */
    /* in that case, so do not error out */
    if (l_data_size != 0 && ! bj) {
        return OPJ_FALSE;
    }
    i = l;

    while (i--) {
        OPJ_INT32 rw1;      /* width of the resolution level once lower than computed one                                       */
        OPJ_INT32 rh1;      /* height of the resolution level once lower than computed one                                      */
        OPJ_INT32 cas_col;  /* 0 = non inversion on horizontal filtering 1 = inversion between low-pass and high-pass filtering */
        OPJ_INT32 cas_row;  /* 0 = non inversion on vertical filtering 1 = inversion between low-pass and high-pass filtering   */
        OPJ_INT32 dn, sn;

        rw  = l_cur_res->x1 - l_cur_res->x0;
        rh  = l_cur_res->y1 - l_cur_res->y0;
        rw1 = l_last_res->x1 - l_last_res->x0;
        rh1 = l_last_res->y1 - l_last_res->y0;

        cas_row = l_cur_res->x0 & 1;
        cas_col = l_cur_res->y0 & 1;

        sn = rh1;
        dn = rh - rh1;
        for (j = 0; j < rw; ++j) {
            aj = a + j;
            for (k = 0; k < rh; ++k) {
                bj[k] = aj[k * w];
            }

            (*p_function)(bj, dn, sn, cas_col);

            opj_dwt_deinterleave_v(bj, aj, dn, sn, w, cas_col);
        }

        sn = rw1;
        dn = rw - rw1;

        for (j = 0; j < rh; j++) {
            aj = a + j * w;
            for (k = 0; k < rw; k++) {
                bj[k] = aj[k];
            }
            (*p_function)(bj, dn, sn, cas_row);
            opj_dwt_deinterleave_h(bj, aj, dn, sn, cas_row);
        }

        l_cur_res = l_last_res;

        --l_last_res;
    }

    opj_free(bj);
    return OPJ_TRUE;
}